

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::changeColsCost(Highs *this,HighsInt num_set_entries,HighsInt *set,double *cost)

{
  byte bVar1;
  HighsStatus from_return_status;
  HighsStatus HVar2;
  Highs *in_RCX;
  HighsIndexCollection *in_RDX;
  HighsStatus in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  HighsStatus return_status;
  HighsStatus call_status;
  HighsInt create_error;
  HighsIndexCollection index_collection;
  vector<int,_std::allocator<int>_> local_set;
  vector<double,_std::allocator<double>_> local_cost;
  HighsLogOptions *pHVar3;
  Highs *in_stack_fffffffffffffd40;
  HighsLogOptions *this_00;
  HighsStatus in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  double *in_stack_fffffffffffffd58;
  HighsInt num_set_entries_00;
  allocator *paVar4;
  undefined4 in_stack_fffffffffffffd60;
  undefined1 ordered;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  double *in_stack_fffffffffffffd70;
  double *in_stack_fffffffffffffd78;
  HighsInt in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  HighsStatus call_status_00;
  undefined7 in_stack_fffffffffffffdc8;
  vector<int,_std::allocator<int>_> *data2;
  HighsInt in_stack_fffffffffffffdf4;
  string local_208 [8];
  double *in_stack_fffffffffffffe00;
  double *in_stack_fffffffffffffe08;
  allocator<char> local_179;
  string local_178 [48];
  undefined8 in_stack_fffffffffffffeb8;
  HighsIndexCollection *in_stack_fffffffffffffec0;
  Highs *in_stack_fffffffffffffec8;
  allocator local_49;
  string local_48 [32];
  Highs *local_28;
  HighsIndexCollection *local_20;
  HighsStatus local_14;
  HighsStatus local_4;
  
  if (in_ESI == kOk) {
    local_4 = kOk;
  }
  else {
    data2 = in_RDI + 0x97;
    paVar4 = &local_49;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"column costs",paVar4);
    bVar1 = doubleUserDataNotNull
                      ((HighsLogOptions *)
                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                       in_stack_fffffffffffffd58,
                       (string *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    ordered = (undefined1)((uint)in_stack_fffffffffffffd60 >> 0x18);
    num_set_entries_00 = (HighsInt)((ulong)in_stack_fffffffffffffd58 >> 0x20);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if ((bVar1 & 1) == 0) {
      clearDerivedModelProperties(in_stack_fffffffffffffd40);
      std::allocator<double>::allocator((allocator<double> *)0x4934b2);
      std::vector<double,std::allocator<double>>::vector<double_const*,void>
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      std::allocator<double>::~allocator((allocator<double> *)0x4934e3);
      std::allocator<int>::allocator((allocator<int> *)0x493513);
      std::vector<int,std::allocator<int>>::vector<int_const*,void>
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 (int *)in_stack_fffffffffffffd78,(int *)in_stack_fffffffffffffd70,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      std::allocator<int>::~allocator((allocator<int> *)0x49353e);
      call_status_00 = local_14;
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x493563);
      this_00 = (HighsLogOptions *)0x0;
      pHVar3 = (HighsLogOptions *)0x0;
      sortSetData(in_stack_fffffffffffffdf4,in_RDI,(double *)paVar4,(double *)in_RCX,(double *)data2
                  ,(double *)CONCAT17(bVar1,in_stack_fffffffffffffdc8),in_stack_fffffffffffffe00,
                  in_stack_fffffffffffffe08);
      HighsIndexCollection::HighsIndexCollection((HighsIndexCollection *)this_00);
      HVar2 = local_14;
      std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x4935c2);
      from_return_status =
           create(local_20,(HighsInt)((ulong)local_28 >> 0x20),
                  (HighsInt *)CONCAT44(call_status_00,in_stack_fffffffffffffd88),HVar2);
      if (from_return_status == kOk) {
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x4937d0);
        in_stack_fffffffffffffd50 =
             changeCostsInterface
                       (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                        (double *)in_stack_fffffffffffffeb8);
        HighsLogOptions::HighsLogOptions(this_00,pHVar3);
        in_stack_fffffffffffffd54 = 0;
        paVar4 = (allocator *)&stack0xfffffffffffffdf7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_208,"changeCosts",paVar4);
        HVar2 = interpretCallStatus((HighsLogOptions *)local_28,call_status_00,from_return_status,
                                    (string *)CONCAT44(HVar2,in_stack_fffffffffffffd80));
        std::__cxx11::string::~string(local_208);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdf7);
        HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4938ba);
        if (HVar2 == kError) {
          local_4 = kError;
        }
        else {
          local_4 = returnFromHighs(local_28,call_status_00);
        }
      }
      else {
        HighsLogOptions::HighsLogOptions(this_00,pHVar3);
        pHVar3 = (HighsLogOptions *)&local_179;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_178,"changeColsCost",(allocator *)pHVar3);
        std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x49366e);
        local_4 = analyseSetCreateError
                            (pHVar3,(string *)CONCAT44(in_stack_fffffffffffffd6c,local_14),
                             from_return_status,(bool)ordered,num_set_entries_00,
                             (HighsInt *)
                             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                             in_stack_fffffffffffffd80);
        std::__cxx11::string::~string(local_178);
        std::allocator<char>::~allocator(&local_179);
        HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4936df);
      }
      HighsIndexCollection::~HighsIndexCollection((HighsIndexCollection *)this_00);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    }
    else {
      local_4 = kError;
    }
  }
  return local_4;
}

Assistant:

HighsStatus Highs::changeColsCost(const HighsInt num_set_entries,
                                  const HighsInt* set, const double* cost) {
  if (num_set_entries == 0) return HighsStatus::kOk;
  // Check for NULL data in "set" version of changeColsCost since
  // values are sorted with set
  if (doubleUserDataNotNull(options_.log_options, cost, "column costs"))
    return HighsStatus::kError;
  clearDerivedModelProperties();
  // Ensure that the set and data are in ascending order
  std::vector<double> local_cost{cost, cost + num_set_entries};
  std::vector<HighsInt> local_set{set, set + num_set_entries};
  sortSetData(num_set_entries, local_set, cost, NULL, NULL, local_cost.data(),
              NULL, NULL);
  HighsIndexCollection index_collection;
  const HighsInt create_error = create(index_collection, num_set_entries,
                                       local_set.data(), model_.lp_.num_col_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "changeColsCost",
                                 create_error, true, num_set_entries,
                                 local_set.data(), model_.lp_.num_col_);
  HighsStatus call_status =
      changeCostsInterface(index_collection, local_cost.data());
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeCosts");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}